

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::JsonObjectWriter::WritePrefix
          (JsonObjectWriter *this,StringPiece name)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ByteSink *in_RCX;
  StringPiece input;
  StringPiece s;
  
  iVar1 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])();
  if (*(char *)(CONCAT44(extraout_var,iVar1) + 0x14) == '\x01') {
    *(undefined1 *)(CONCAT44(extraout_var,iVar1) + 0x14) = 0;
    iVar1 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    if (*(long *)(CONCAT44(extraout_var_00,iVar1) + 8) == 0) goto LAB_003187cc;
  }
  else {
    WriteChar(this,',');
  }
  NewLine(this);
LAB_003187cc:
  if ((char *)name.length_ == (char *)0x0) {
    iVar1 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    if (*(char *)(CONCAT44(extraout_var_01,iVar1) + 0x15) != '\x01') {
      return;
    }
    WriteChar(this,'\"');
  }
  else {
    WriteChar(this,'\"');
    input.length_ = (stringpiece_ssize_type)&this->sink_;
    input.ptr_ = (char *)name.length_;
    JsonEscaping::Escape((JsonEscaping *)name.ptr_,input,in_RCX);
  }
  s.length_ = 2;
  s.ptr_ = "\":";
  WriteRawString(this,s);
  if ((this->indent_string_)._M_string_length == 0) {
    return;
  }
  WriteChar(this,' ');
  return;
}

Assistant:

void JsonObjectWriter::WritePrefix(StringPiece name) {
  bool not_first = !element()->is_first();
  if (not_first) WriteChar(',');
  if (not_first || !element()->is_root()) NewLine();
  if (!name.empty() || element()->is_json_object()) {
    WriteChar('"');
    if (!name.empty()) {
      JsonEscaping::Escape(name, &sink_);
    }
    WriteRawString("\":");
    if (!indent_string_.empty()) WriteChar(' ');
  }
}